

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode deflate_init_writer(Curl_easy *data,contenc_writer *writer)

{
  int iVar1;
  CURLcode CVar2;
  zlib_writer *zp;
  
  if (writer->downstream != (contenc_writer *)0x0) {
    writer[5].downstream = (contenc_writer *)zalloc_cb;
    writer[6].handler = (content_encoding *)zfree_cb;
    iVar1 = cm_zlib_inflateInit_((z_streamp)&writer[1].downstream,"1.2.12",0x70);
    if (iVar1 == 0) {
      *(undefined4 *)&writer[1].handler = 1;
      CVar2 = CURLE_OK;
    }
    else {
      process_zlib_error(data,(z_stream *)&writer[1].downstream);
      CVar2 = CURLE_BAD_CONTENT_ENCODING;
    }
    return CVar2;
  }
  return CURLE_WRITE_ERROR;
}

Assistant:

static CURLcode deflate_init_writer(struct Curl_easy *data,
                                    struct contenc_writer *writer)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!writer->downstream)
    return CURLE_WRITE_ERROR;

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(inflateInit(z) != Z_OK)
    return process_zlib_error(data, z);
  zp->zlib_init = ZLIB_INIT;
  return CURLE_OK;
}